

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O0

void cf_cbc_encrypt(cf_cbc *ctx,uint8_t *input,uint8_t *output,size_t blocks)

{
  size_t len;
  size_t nblk;
  uint8_t buf [16];
  size_t blocks_local;
  uint8_t *output_local;
  uint8_t *input_local;
  cf_cbc *ctx_local;
  
  len = ctx->prp->blocksz;
  buf._8_8_ = blocks;
  blocks_local = (size_t)output;
  output_local = input;
  while (buf._8_8_ != 0) {
    buf._8_8_ = buf._8_8_ + -1;
    xor_bb((uint8_t *)&nblk,output_local,ctx->block,len);
    (*ctx->prp->encrypt)(ctx->prpctx,(uint8_t *)&nblk,ctx->block);
    memcpy((void *)blocks_local,ctx->block,len);
    output_local = output_local + len;
    blocks_local = len + blocks_local;
  }
  return;
}

Assistant:

void cf_cbc_encrypt(cf_cbc *ctx, const uint8_t *input, uint8_t *output, size_t blocks)
{
  uint8_t buf[CF_MAXBLOCK];
  size_t nblk = ctx->prp->blocksz;

  while (blocks--)
  {
    xor_bb(buf, input, ctx->block, nblk);
    ctx->prp->encrypt(ctx->prpctx, buf, ctx->block);
    memcpy(output, ctx->block, nblk);
    input += nblk;
    output += nblk;
  }
}